

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

bool __thiscall rw::Geometry::streamWrite(Geometry *this,Stream *stream)

{
  MorphTarget *pMVar1;
  undefined8 s;
  uint32 uVar2;
  MorphTarget *m;
  undefined4 local_38;
  int32 i_2;
  uint32 tribuf [2];
  int32 i_1;
  int32 i;
  GeoStreamData buf;
  Stream *stream_local;
  Geometry *this_local;
  
  buf._8_8_ = stream;
  uVar2 = streamGetSize(this);
  writeChunkHeader(stream,0xf,uVar2);
  s = buf._8_8_;
  uVar2 = geoStructSize(this);
  writeChunkHeader((Stream *)s,1,uVar2);
  i_1 = this->flags | this->numTexCoordSets << 0x10;
  i = this->numTriangles;
  buf.flags = this->numVertices;
  buf.numTriangles = this->numMorphTargets;
  Stream::write32((Stream *)buf._8_8_,&i_1,0x10);
  if (version < 0x34000) {
    Stream::write32((Stream *)buf._8_8_,streamWrite::fbuf,0xc);
  }
  if ((this->flags & 0x1000000) == 0) {
    if ((this->flags & 8) != 0) {
      (**(code **)(*(long *)buf._8_8_ + 0x18))(buf._8_8_,this->colors,this->numVertices << 2);
    }
    for (tribuf[1] = 0; (int)tribuf[1] < this->numTexCoordSets; tribuf[1] = tribuf[1] + 1) {
      Stream::write32((Stream *)buf._8_8_,this->texCoords[(int)tribuf[1]],this->numVertices << 3);
    }
    for (tribuf[0] = 0; (int)tribuf[0] < this->numTriangles; tribuf[0] = tribuf[0] + 1) {
      local_38 = CONCAT22(this->triangles[(int)tribuf[0]].v[0],this->triangles[(int)tribuf[0]].v[1])
      ;
      i_2 = CONCAT22(this->triangles[(int)tribuf[0]].v[2],this->triangles[(int)tribuf[0]].matId);
      Stream::write32((Stream *)buf._8_8_,&local_38,8);
    }
  }
  for (m._4_4_ = 0; m._4_4_ < this->numMorphTargets; m._4_4_ = m._4_4_ + 1) {
    pMVar1 = this->morphTargets;
    Stream::write32((Stream *)buf._8_8_,&pMVar1[m._4_4_].boundingSphere,0x10);
    if ((this->flags & 0x1000000) == 0) {
      Stream::writeI32((Stream *)buf._8_8_,(uint)(pMVar1[m._4_4_].vertices != (V3d *)0x0));
      Stream::writeI32((Stream *)buf._8_8_,(uint)(pMVar1[m._4_4_].normals != (V3d *)0x0));
      if (pMVar1[m._4_4_].vertices != (V3d *)0x0) {
        Stream::write32((Stream *)buf._8_8_,pMVar1[m._4_4_].vertices,this->numVertices * 0xc);
      }
      if (pMVar1[m._4_4_].normals != (V3d *)0x0) {
        Stream::write32((Stream *)buf._8_8_,pMVar1[m._4_4_].normals,this->numVertices * 0xc);
      }
    }
    else {
      Stream::writeI32((Stream *)buf._8_8_,0);
      Stream::writeI32((Stream *)buf._8_8_,0);
    }
  }
  MaterialList::streamWrite(&this->matList,(Stream *)buf._8_8_);
  PluginList::streamWrite((PluginList *)&s_plglist,(Stream *)buf._8_8_,this);
  return true;
}

Assistant:

bool
Geometry::streamWrite(Stream *stream)
{
	GeoStreamData buf;
	static float32 fbuf[3] = { 1.0f, 1.0f, 1.0f };

	writeChunkHeader(stream, ID_GEOMETRY, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, geoStructSize(this));

	buf.flags = this->flags | this->numTexCoordSets << 16;
	buf.numTriangles = this->numTriangles;
	buf.numVertices = this->numVertices;
	buf.numMorphTargets = this->numMorphTargets;
	stream->write32(&buf, sizeof(buf));
	if(version < 0x34000)
		stream->write32(fbuf, sizeof(fbuf));

	if(!(this->flags & NATIVE)){
		if(this->flags & PRELIT)
			stream->write8(this->colors, 4*this->numVertices);
		for(int32 i = 0; i < this->numTexCoordSets; i++)
			stream->write32(this->texCoords[i],
				    2*this->numVertices*4);
		for(int32 i = 0; i < this->numTriangles; i++){
			uint32 tribuf[2];
			tribuf[0] = this->triangles[i].v[0] << 16 |
			            this->triangles[i].v[1];
			tribuf[1] = this->triangles[i].v[2] << 16 |
			            this->triangles[i].matId;
			stream->write32(tribuf, 8);
		}
	}

	for(int32 i = 0; i < this->numMorphTargets; i++){
		MorphTarget *m = &this->morphTargets[i];
		stream->write32(&m->boundingSphere, 4*4);
		if(!(this->flags & NATIVE)){
			stream->writeI32(m->vertices != nil);
			stream->writeI32(m->normals != nil);
			if(m->vertices)
				stream->write32(m->vertices,
				             3*this->numVertices*4);
			if(m->normals)
				stream->write32(m->normals,
				             3*this->numVertices*4);
		}else{
			stream->writeI32(0);
			stream->writeI32(0);
		}
	}

	this->matList.streamWrite(stream);

	s_plglist.streamWrite(stream, this);
	return true;
}